

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall
dmlc::JSONWriter::
WriteObjectKeyValue<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
          (JSONWriter *this,string *key,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
          *value)

{
  pointer puVar1;
  ostream *poVar2;
  pointer pcVar3;
  ulong uVar4;
  iterator __position;
  undefined8 *puVar5;
  unsigned_long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,", ",2);
  }
  WriteSeperator(this);
  local_58 = CONCAT71(local_58._1_7_,0x22);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,(char *)&local_58,1);
  poVar2 = this->os_;
  pcVar3 = (key->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\": ",3);
  puVar1 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  uVar4 = *(ulong *)(value + 0x18);
  local_58 = CONCAT71(local_58._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,(char *)&local_58,1);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->scope_multi_line_,1 < uVar4);
  local_58 = 0;
  __position._M_current =
       (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->scope_counter_,__position,&local_58);
  }
  else {
    *__position._M_current = 0;
    (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  for (puVar5 = *(undefined8 **)(value + 0x10); puVar5 != (undefined8 *)0x0;
      puVar5 = (undefined8 *)*puVar5) {
    WriteObjectKeyValue<tvm::runtime::FunctionInfo>
              (this,(string *)(puVar5 + 1),(FunctionInfo *)(puVar5 + 5));
  }
  EndObject(this);
  return;
}

Assistant:

inline void JSONWriter::WriteObjectKeyValue(const std::string &key,
                                            const ValueType &value) {
  if (scope_counter_.back() > 0) {
    Extend(os_, ", ");
  }
  WriteSeperator();
  Extend(os_, '\"');
  Extend(os_, key);
  Extend(os_, "\": ");
  scope_counter_.back() += 1;
  json::Handler<ValueType>::Write(this, value);
}